

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::cleanupDraw(RenderTarget *this,RenderStates *states)

{
  RenderTarget *in_RSI;
  Shader *in_RDI;
  RenderTarget *unaff_retaddr;
  Shader *texture;
  
  texture = in_RDI;
  if (*(long *)((in_RSI->m_defaultView).m_transform.m_matrix + 0xd) != 0) {
    applyShader(in_RSI,in_RDI);
  }
  if ((*(long *)((in_RSI->m_defaultView).m_transform.m_matrix + 0xb) != 0) &&
     ((*(byte *)(*(long *)((in_RSI->m_defaultView).m_transform.m_matrix + 0xb) + 0x18) & 1) != 0)) {
    applyTexture(unaff_retaddr,(Texture *)texture);
  }
  *(undefined1 *)&in_RDI[3].m_textures._M_t._M_impl.super__Rb_tree_header._M_header._M_left = 1;
  return;
}

Assistant:

void RenderTarget::cleanupDraw(const RenderStates& states)
{
    // Unbind the shader, if any
    if (states.shader)
        applyShader(NULL);

    // If the texture we used to draw belonged to a RenderTexture, then forcibly unbind that texture.
    // This prevents a bug where some drivers do not clear RenderTextures properly.
    if (states.texture && states.texture->m_fboAttachment)
        applyTexture(NULL);

    // Re-enable the cache at the end of the draw if it was disabled
    m_cache.enable = true;
}